

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::ml_literal_string(spec *s)

{
  either *in_RDI;
  anon_class_8_1_54a39813 mll_content;
  anon_class_1_0_00000001 mll_quotes;
  char (*in_stack_fffffffffffffe58) [4];
  either *in_stack_fffffffffffffe60;
  either *s_00;
  either *in_stack_fffffffffffffe78;
  sequence *in_stack_fffffffffffffe80;
  repeat_at_least *in_stack_fffffffffffffe88;
  maybe *in_stack_fffffffffffffe90;
  literal *in_stack_fffffffffffffe98;
  sequence *in_stack_fffffffffffffea0;
  spec *in_stack_fffffffffffffea8;
  maybe *in_stack_fffffffffffffeb0;
  anon_class_8_1_54a39813 *in_stack_fffffffffffffeb8;
  
  s_00 = in_RDI;
  literal::literal<4ul>((literal *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  newline(in_stack_fffffffffffffea8);
  maybe::maybe<toml::detail::either>((maybe *)s_00,in_RDI);
  ml_literal_string::anon_class_8_1_54a39813::operator()(in_stack_fffffffffffffeb8);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,s_00);
  ml_literal_string::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffffea8);
  ml_literal_string::anon_class_8_1_54a39813::operator()(in_stack_fffffffffffffeb8);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,s_00);
  sequence::sequence<toml::detail::either,toml::detail::repeat_at_least>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(repeat_at_least *)s_00);
  repeat_at_least::repeat_at_least<toml::detail::sequence>
            ((repeat_at_least *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
             (sequence *)s_00);
  literal::literal<4ul>((literal *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  ml_literal_string::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffffea8);
  maybe::maybe<toml::detail::either>((maybe *)s_00,in_RDI);
  sequence::
  sequence<toml::detail::literal,toml::detail::maybe,toml::detail::repeat_at_least,toml::detail::repeat_at_least,toml::detail::literal,toml::detail::maybe>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88,(repeat_at_least *)in_stack_fffffffffffffe80,
             (literal *)in_stack_fffffffffffffe78,in_stack_fffffffffffffeb0);
  maybe::~maybe((maybe *)in_stack_fffffffffffffe60);
  either::~either(in_stack_fffffffffffffe60);
  literal::~literal((literal *)0x75cf0e);
  repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffe60);
  sequence::~sequence((sequence *)in_stack_fffffffffffffe60);
  repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffe60);
  either::~either(in_stack_fffffffffffffe60);
  either::~either(in_stack_fffffffffffffe60);
  repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffe60);
  either::~either(in_stack_fffffffffffffe60);
  maybe::~maybe((maybe *)in_stack_fffffffffffffe60);
  either::~either(in_stack_fffffffffffffe60);
  literal::~literal((literal *)0x75cf8d);
  return (sequence *)s_00;
}

Assistant:

TOML11_INLINE sequence ml_literal_string(const spec& s)
{
    const auto mll_quotes = []() {
        return either(literal("''"), character('\''));
    };
    const auto mll_content = [&s]() {
        return either(literal_char(s), newline(s));
    };

    return sequence(
            literal("'''"),
            maybe(newline(s)),
            repeat_at_least(0, mll_content()),
            repeat_at_least(0, sequence(
                    mll_quotes(),
                    repeat_at_least(1, mll_content())
                )
            ),
            literal("'''"),
            maybe(mll_quotes())
            // XXX ''' and mll_quotes are intentionally reordered to avoid
            //     unexpected match of mll_quotes
        );
}